

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_2,int iteration)

{
  uint in_EDX;
  string *in_RDI;
  StreamingListener *unaff_retaddr;
  String *this_00;
  String local_48;
  string local_38 [16];
  String *in_stack_ffffffffffffffd8;
  
  this_00 = &local_48;
  String::Format((char *)this_00,"event=TestIterationStart&iteration=%d\n",(ulong)in_EDX);
  String::operator_cast_to_string(in_stack_ffffffffffffffd8);
  Send(unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_38);
  String::~String(this_00);
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    Send(String::Format("event=TestIterationStart&iteration=%d\n",
                        iteration));
  }